

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

double units::getNumberBlock(string *ustring,size_t *index)

{
  byte bVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  double dVar7;
  size_t ival;
  size_t ind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substr;
  size_t local_68;
  double local_60;
  size_t local_58;
  string local_50;
  double local_30;
  
  if (*(ustring->_M_dataplus)._M_p == '(') {
    local_68 = 1;
    bVar3 = segmentcheck(ustring,')',&local_68);
    if (!bVar3) {
      return NAN;
    }
    if (local_68 == 2) {
      *index = 2;
      return 1.0;
    }
    if (local_68 - 1 < 2) {
      bVar3 = false;
    }
    else {
      lVar4 = 0;
      bVar5 = false;
      do {
        bVar1 = (ustring->_M_dataplus)._M_p[lVar4 + 1];
        bVar3 = bVar5;
        if (9 < (byte)(bVar1 - 0x30)) {
          uVar6 = bVar1 - 0x28;
          if (0x3d < uVar6) {
            return NAN;
          }
          bVar3 = true;
          if (((0x40000000000087U >> ((ulong)uVar6 & 0x3f) & 1) == 0) &&
             (bVar3 = bVar5, (0x2000000000000060U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) {
            return NAN;
          }
        }
        lVar4 = lVar4 + 1;
        bVar5 = bVar3;
      } while (local_68 - 2 != lVar4);
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)ustring);
    local_58 = 0;
    if (bVar3) {
      local_60 = generateLeadingNumber(&local_50,&local_58);
    }
    else {
      local_60 = getDoubleFromString(&local_50,&local_58);
    }
    sVar2 = local_58;
    if (local_50._M_string_length <= local_58) {
      *index = local_68;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (sVar2 < local_50._M_string_length) {
      return NAN;
    }
  }
  else {
    local_60 = getDoubleFromString(ustring,index);
  }
  if (NAN(local_60)) {
    return local_60;
  }
  if (*index < ustring->_M_string_length) {
    if ((ustring->_M_dataplus)._M_p[*index] != '^') {
      return local_60;
    }
    local_68 = 0;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)ustring);
    dVar7 = getNumberBlock(&local_50,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      local_30 = dVar7;
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      dVar7 = local_30;
    }
    if (NAN(dVar7)) {
      *index = 0;
      return NAN;
    }
    *index = local_68 + *index + 1;
    dVar7 = pow(local_60,dVar7);
    return dVar7;
  }
  return local_60;
}

Assistant:

static double getNumberBlock(const std::string& ustring, size_t& index) noexcept
{
    double val{constants::invalid_conversion};
    if (ustring.front() == '(') {
        size_t ival{1};
        if (segmentcheck(ustring, ')', ival)) {
            if (ival == 2) {
                index = ival;
                return 1.0;
            }
            bool hasOp = false;
            for (size_t ii = 1; ii < ival - 1; ++ii) {
                auto c = ustring[ii];
                if (c >= '0' && c <= '9') {
                    continue;
                }
                switch (c) {
                    case '-':
                    case '.':
                    case 'e':
                        break;
                    case '*':
                    case '/':
                    case '^':
                    case '(':
                    case ')':
                        hasOp = true;
                        break;
                    default:
                        return constants::invalid_conversion;
                }
            }
            auto substr = ustring.substr(1, ival - 2);
            size_t ind{0};
            if (hasOp) {
                val = generateLeadingNumber(substr, ind);
            } else {
                val = getDoubleFromString(substr, &ind);
            }
            if (ind < substr.size()) {
                return constants::invalid_conversion;
            }
            index = ival;
        } else {
            return constants::invalid_conversion;
        }
    } else {
        val = getDoubleFromString(ustring, &index);
    }
    if (!std::isnan(val) && index < ustring.size()) {
        if (ustring[index] == '^') {
            size_t nindex{0};
            double pval = getNumberBlock(ustring.substr(index + 1), nindex);
            if (!std::isnan(pval)) {
                index += nindex + 1;
                return std::pow(val, pval);
            }
            index = 0;
            return constants::invalid_conversion;
        }
    }
    return val;
}